

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool processSources(cmGeneratorTarget *tgt,
                   vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                   *entries,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *srcs,
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *uniqueSrcs,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
                   bool debugSources)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pBVar2;
  pointer pcVar3;
  cmLocalGenerator *this;
  pointer pbVar4;
  char cVar5;
  bool bVar6;
  byte bVar7;
  string *psVar8;
  string *psVar9;
  cmSourceFile *this_00;
  ostream *poVar10;
  long *plVar11;
  cmake *pcVar12;
  size_type *psVar13;
  long lVar14;
  pointer sourceName;
  char *pcVar15;
  pointer pbVar16;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar17;
  undefined7 in_stack_00000009;
  char in_stack_00000010;
  undefined4 local_29c;
  string e;
  undefined4 local_274;
  string fullPath;
  string local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entrySources;
  long *local_208 [2];
  long local_1f8 [2];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1e8;
  string *local_1e0;
  pointer *local_1d8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1d0;
  __hashtable *__h;
  cmMakefile *local_1c0;
  cmListFileBacktrace local_1b8;
  string usedSources;
  ios_base local_138 [264];
  
  if ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)entries == srcs) {
    bVar7 = 0;
  }
  else {
    local_1c0 = tgt->Target->Makefile;
    local_274 = SUB84(local_1c0,0);
    local_29c = 0;
    local_1e8 = srcs;
    local_1e0 = config;
    local_1d0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                uniqueSrcs;
    __h = (__hashtable *)dagChecker;
    do {
      pBVar2 = *(pointer *)entries;
      local_1d8 = (pointer *)entries;
      psVar8 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)(pBVar2->Value)._M_string_length);
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      entrySources.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
      usedSources._M_string_length = 0;
      usedSources.field_2._M_local_buf[0] = '\0';
      psVar9 = (string *)
               (**(code **)((pBVar2->Value)._M_dataplus._M_p + 0x10))
                         (pBVar2,tgt->LocalGenerator,CONCAT71(in_stack_00000009,debugSources),0,tgt,
                          tgt,local_1e0,(cmGeneratorTarget *)&usedSources);
      cmSystemTools::ExpandListArgument(psVar9,&entrySources,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      cVar5 = (**(code **)((pBVar2->Value)._M_dataplus._M_p + 0x30))();
      pbVar16 = entrySources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (cVar5 != '\0') {
        local_29c = 1;
      }
      sourceName = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      if (entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          entrySources.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
      }
      else {
        do {
          this_00 = cmMakefile::GetOrCreateSource(local_1c0,sourceName,false,Ambiguous);
          e._M_dataplus._M_p = (pointer)&e.field_2;
          e._M_string_length = 0;
          e.field_2._M_allocated_capacity = e.field_2._M_allocated_capacity & 0xffffffffffffff00;
          psVar9 = cmSourceFile::GetFullPath(this_00,&e);
          fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
          pcVar3 = (psVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&fullPath,pcVar3,pcVar3 + psVar9->_M_string_length);
          if (fullPath._M_string_length == 0) {
            if (e._M_string_length != 0) {
              pcVar12 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&usedSources);
              cmake::IssueMessage(pcVar12,FATAL_ERROR,&e,(cmListFileBacktrace *)&usedSources);
              if (usedSources._M_string_length != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           usedSources._M_string_length);
              }
            }
LAB_00321b6c:
            bVar6 = false;
            local_274 = local_29c;
          }
          else {
            if ((psVar8->_M_string_length != 0) &&
               (bVar6 = cmsys::SystemTools::FileIsFullPath(sourceName), !bVar6)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&usedSources);
              if (psVar8->_M_string_length == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&usedSources,
                           "Found relative path while evaluating sources of \"",0x31);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&usedSources,(tgt->Target->Name)._M_dataplus._M_p,
                                     (tgt->Target->Name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\":\n  \"",6);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(sourceName->_M_dataplus)._M_p,
                                     sourceName->_M_string_length);
                lVar14 = 2;
                pcVar15 = "\"\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&usedSources,"Target \"",8);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&usedSources,(psVar8->_M_dataplus)._M_p,
                                     psVar8->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36)
                ;
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(sourceName->_M_dataplus)._M_p,
                                     sourceName->_M_string_length);
                lVar14 = 1;
                pcVar15 = "\"";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar14);
              this = tgt->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_248);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
                operator_delete(local_248._M_dataplus._M_p,
                                local_248.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&usedSources);
              std::ios_base::~ios_base(local_138);
              goto LAB_00321b6c;
            }
            bVar6 = true;
            std::__cxx11::string::_M_assign((string *)sourceName);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
            operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)e._M_dataplus._M_p != &e.field_2) {
            operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
          }
          pbVar4 = entrySources.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (!bVar6) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&entrySources);
            bVar7 = (byte)local_274;
            goto LAB_00321ffd;
          }
          sourceName = sourceName + 1;
        } while (sourceName != pbVar16);
        usedSources._M_dataplus._M_p = (pointer)&usedSources.field_2;
        usedSources._M_string_length = 0;
        usedSources.field_2._M_local_buf[0] = '\0';
        paVar1 = &e.field_2;
        pbVar16 = entrySources.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (entrySources.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            entrySources.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            e._M_dataplus._M_p = (pointer)__h;
            pVar17 = std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)__h,pbVar16,&e);
            if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (**(code **)((pBVar2->Value)._M_dataplus._M_p + 0x20))(&e);
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string_const&,cmListFileBacktrace>
                        (local_1d0,pbVar16,(cmListFileBacktrace *)&e);
              if (e._M_string_length != 0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)e._M_string_length);
              }
              if (in_stack_00000010 != '\0') {
                std::operator+(&fullPath," * ",pbVar16);
                plVar11 = (long *)std::__cxx11::string::append((char *)&fullPath);
                psVar13 = (size_type *)(plVar11 + 2);
                if ((size_type *)*plVar11 == psVar13) {
                  e.field_2._M_allocated_capacity = *psVar13;
                  e.field_2._8_8_ = plVar11[3];
                  e._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  e.field_2._M_allocated_capacity = *psVar13;
                  e._M_dataplus._M_p = (pointer)*plVar11;
                }
                e._M_string_length = plVar11[1];
                *plVar11 = (long)psVar13;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&usedSources,(ulong)e._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)e._M_dataplus._M_p != paVar1) {
                  operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
                  operator_delete(fullPath._M_dataplus._M_p,
                                  fullPath.field_2._M_allocated_capacity + 1);
                }
              }
            }
            pbVar16 = pbVar16 + 1;
          } while (pbVar16 != pbVar4);
          if (usedSources._M_string_length != 0) {
            pcVar12 = cmLocalGenerator::GetCMakeInstance(tgt->LocalGenerator);
            local_208[0] = local_1f8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_208,"Used sources for target ","");
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)local_208,
                                         (ulong)(tgt->Target->Name)._M_dataplus._M_p);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            psVar13 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar13) {
              local_248.field_2._M_allocated_capacity = *psVar13;
              local_248.field_2._8_8_ = plVar11[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = *psVar13;
              local_248._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_248._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_248);
            fullPath._M_dataplus._M_p = (pointer)&fullPath.field_2;
            psVar13 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar13) {
              fullPath.field_2._M_allocated_capacity = *psVar13;
              fullPath.field_2._8_8_ = plVar11[3];
            }
            else {
              fullPath.field_2._M_allocated_capacity = *psVar13;
              fullPath._M_dataplus._M_p = (pointer)*plVar11;
            }
            fullPath._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&fullPath,(ulong)usedSources._M_dataplus._M_p);
            psVar13 = (size_type *)(plVar11 + 2);
            if ((size_type *)*plVar11 == psVar13) {
              e.field_2._M_allocated_capacity = *psVar13;
              e.field_2._8_8_ = plVar11[3];
              e._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              e.field_2._M_allocated_capacity = *psVar13;
              e._M_dataplus._M_p = (pointer)*plVar11;
            }
            e._M_string_length = plVar11[1];
            *plVar11 = (long)psVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            (**(code **)((pBVar2->Value)._M_dataplus._M_p + 0x20))(&local_1b8);
            cmake::IssueMessage(pcVar12,LOG,&e,&local_1b8);
            if (local_1b8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b8.TopEntry.
                         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)e._M_dataplus._M_p != paVar1) {
              operator_delete(e._M_dataplus._M_p,e.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)fullPath._M_dataplus._M_p != &fullPath.field_2) {
              operator_delete(fullPath._M_dataplus._M_p,fullPath.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedSources._M_dataplus._M_p != &usedSources.field_2) {
        operator_delete(usedSources._M_dataplus._M_p,
                        CONCAT71(usedSources.field_2._M_allocated_capacity._1_7_,
                                 usedSources.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&entrySources);
      entries = (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 *)(local_1d8 + 1);
    } while ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)entries != local_1e8);
    bVar7 = (byte)local_29c;
  }
LAB_00321ffd:
  return (bool)(bVar7 & 1);
}

Assistant:

static bool processSources(
  cmGeneratorTarget const* tgt,
  const std::vector<cmGeneratorTarget::TargetPropertyEntry*>& entries,
  std::vector<BT<std::string>>& srcs,
  std::unordered_set<std::string>& uniqueSrcs,
  cmGeneratorExpressionDAGChecker* dagChecker, std::string const& config,
  bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = false;

  for (cmGeneratorTarget::TargetPropertyEntry* entry : entries) {
    cmLinkImplItem const& item = entry->LinkImplItem;
    std::string const& targetName = item.AsStr();
    std::vector<std::string> entrySources;
    cmSystemTools::ExpandListArgument(entry->Evaluate(tgt->GetLocalGenerator(),
                                                      config, false, tgt, tgt,
                                                      dagChecker),
                                      entrySources);

    if (entry->GetHadContextSensitiveCondition()) {
      contextDependent = true;
    }

    for (std::string& src : entrySources) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string fullPath = sf->GetFullPath(&e);
      if (fullPath.empty()) {
        if (!e.empty()) {
          cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entrySources) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry->GetBacktrace());
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry->GetBacktrace());
    }
  }
  return contextDependent;
}